

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.hpp
# Opt level: O0

void __thiscall qe::Loader<7U>::load(Loader<7U> *this)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  istream *piVar5;
  undefined8 uVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  size_type sVar13;
  ulong uVar14;
  loader_error *plVar15;
  reference pvVar16;
  reference __args;
  reference __args_1;
  int local_640;
  int local_63c;
  ivec2 index;
  uint i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  undefined1 local_5e9;
  string local_5e8;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0;
  string local_580;
  undefined1 local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d4 [8];
  array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> points;
  string local_498;
  undefined1 local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined1 local_3f0 [8];
  vec3 v_1;
  string local_3c0;
  undefined1 local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  undefined1 local_318 [8];
  vec3 v;
  string local_2e8;
  undefined1 local_2c8 [8];
  string line;
  undefined1 local_2a0 [8];
  subobj_t tobj;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  indices;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  tnormals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  tvertices;
  long local_218;
  ifstream file;
  Loader<7U> *this_local;
  
  std::ifstream::ifstream(&local_218,(string *)&this->_path,_S_in);
  std::ios::exceptions((int)&local_218 + (int)*(undefined8 *)(local_218 + -0x18));
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&tnormals.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&indices.
               super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
            *)&tobj.size);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_2a0,"",(allocator *)(line.field_2._M_local_buf + 0xf));
  tobj.name.field_2._8_8_ = 0;
  tobj.index = 0;
  std::allocator<char>::~allocator((allocator<char> *)(line.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_2c8);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_218,(string *)local_2c8,'\n');
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    std::__cxx11::string::string((string *)&local_2e8,(string *)local_2c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)((long)&v.field_0 + 8),"v ",(allocator *)((long)&v.field_0 + 7));
    bVar2 = startswith(&local_2e8,(string *)((long)&v.field_0 + 8));
    std::__cxx11::string::~string((string *)((long)&v.field_0 + 8));
    std::allocator<char>::~allocator((allocator<char> *)((long)&v.field_0 + 7));
    std::__cxx11::string::~string((string *)&local_2e8);
    if (bVar2) {
      uVar6 = std::__cxx11::string::c_str();
      iVar4 = __isoc99_sscanf(uVar6,"v %f %f %f",local_318,local_318 + 4,&v);
      if (iVar4 + 1U < 2) {
        local_399 = 1;
        plVar15 = (loader_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_398,(string *)&this->_path);
        std::operator+(&local_378,&local_398,"(");
        std::operator+(&local_358,&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c8);
        std::operator+(&local_338,&local_358,")");
        loader_error::loader_error
                  (plVar15,&local_338,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                   ,0x10b);
        local_399 = 0;
        __cxa_throw(plVar15,&loader_error::typeinfo,loader_error::~loader_error);
      }
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&tnormals.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_318);
    }
    else {
      std::__cxx11::string::string((string *)&local_3c0,(string *)local_2c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)&v_1.field_0 + 8),"vn ",(allocator *)((long)&v_1.field_0 + 7));
      bVar2 = startswith(&local_3c0,(string *)((long)&v_1.field_0 + 8));
      std::__cxx11::string::~string((string *)((long)&v_1.field_0 + 8));
      std::allocator<char>::~allocator((allocator<char> *)((long)&v_1.field_0 + 7));
      std::__cxx11::string::~string((string *)&local_3c0);
      if (bVar2) {
        uVar6 = std::__cxx11::string::c_str();
        iVar4 = __isoc99_sscanf(uVar6,"vn %f %f %f",local_3f0,local_3f0 + 4,&v_1);
        if (iVar4 + 1U < 2) {
          local_471 = 1;
          plVar15 = (loader_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)&local_470,(string *)&this->_path);
          std::operator+(&local_450,&local_470,"(");
          std::operator+(&local_430,&local_450,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c8);
          std::operator+(&local_410,&local_430,")");
          loader_error::loader_error
                    (plVar15,&local_410,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                     ,0x115);
          local_471 = 0;
          __cxa_throw(plVar15,&loader_error::typeinfo,loader_error::~loader_error);
        }
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     *)&indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_3f0);
      }
      else {
        std::__cxx11::string::string((string *)&local_498,(string *)local_2c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)((long)&points._M_elems[2].field_0 + 4),"f ",
                   (allocator *)((long)&points._M_elems[2].field_0 + 3));
        bVar2 = startswith(&local_498,(string *)((long)&points._M_elems[2].field_0 + 4));
        std::__cxx11::string::~string((string *)((long)&points._M_elems[2].field_0 + 4));
        std::allocator<char>::~allocator((allocator<char> *)((long)&points._M_elems[2].field_0 + 3))
        ;
        std::__cxx11::string::~string((string *)&local_498);
        if (bVar2) {
          uVar6 = std::__cxx11::string::c_str();
          pvVar7 = std::array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL>::operator[]
                             ((array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> *)local_4d4,
                              0);
          pvVar8 = std::array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL>::operator[]
                             ((array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> *)local_4d4,
                              0);
          pvVar9 = std::array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL>::operator[]
                             ((array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> *)local_4d4,
                              1);
          pvVar10 = std::array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL>::operator[]
                              ((array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> *)local_4d4
                               ,1);
          pvVar11 = std::array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL>::operator[]
                              ((array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> *)local_4d4
                               ,2);
          pvVar12 = std::array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL>::operator[]
                              ((array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> *)local_4d4
                               ,2);
          iVar4 = __isoc99_sscanf(uVar6,"f %u//%u %u//%u %u//%u",pvVar7,
                                  (undefined1 *)((long)&pvVar8->field_0 + 4),pvVar9,
                                  (undefined1 *)((long)&pvVar10->field_0 + 4),pvVar11,
                                  (undefined1 *)((long)&pvVar12->field_0 + 4));
          if (iVar4 + 1U < 2) {
            local_559 = 1;
            plVar15 = (loader_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string((string *)&local_558,(string *)&this->_path);
            std::operator+(&local_538,&local_558," (");
            std::operator+(&local_518,&local_538,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2c8);
            std::operator+(&local_4f8,&local_518,")");
            loader_error::loader_error
                      (plVar15,&local_4f8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                       ,0x122);
            local_559 = 0;
            __cxa_throw(plVar15,&loader_error::typeinfo,loader_error::~loader_error);
          }
          pvVar7 = std::array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL>::operator[]
                             ((array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> *)local_4d4,
                              0);
          std::
          vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
          ::push_back((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       *)&tobj.size,pvVar7);
          pvVar7 = std::array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL>::operator[]
                             ((array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> *)local_4d4,
                              1);
          std::
          vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
          ::push_back((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       *)&tobj.size,pvVar7);
          pvVar7 = std::array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL>::operator[]
                             ((array<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_3UL> *)local_4d4,
                              2);
          std::
          vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
          ::push_back((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       *)&tobj.size,pvVar7);
        }
        else {
          std::__cxx11::string::string((string *)&local_580,(string *)local_2c8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_5a0,"o ",&local_5a1);
          bVar2 = startswith(&local_580,&local_5a0);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
          std::__cxx11::string::~string((string *)&local_580);
          if (bVar2) {
            sVar13 = std::
                     vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                     ::size((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                             *)&tobj.size);
            tobj.index = sVar13 - tobj.name.field_2._8_8_;
            uVar14 = std::__cxx11::string::empty();
            if ((uVar14 & 1) != 0) {
              std::__cxx11::string::operator=((string *)local_2a0,"FIRSTNONAME");
            }
            std::vector<qe::subobj_t,_std::allocator<qe::subobj_t>_>::push_back
                      (&this->_objects,(value_type *)local_2a0);
            std::__cxx11::string::substr((ulong)local_5c8,(ulong)local_2c8);
            std::__cxx11::string::operator=((string *)local_2a0,local_5c8);
            std::__cxx11::string::~string(local_5c8);
            tobj.name.field_2._8_8_ =
                 std::
                 vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                 ::size((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                         *)&tobj.size);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_2c8);
  sVar13 = std::
           vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
           ::size((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                   *)&tobj.size);
  tobj.index = sVar13 - tobj.name.field_2._8_8_;
  uVar14 = std::__cxx11::string::empty();
  if ((uVar14 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_2a0,"NONAME");
  }
  std::vector<qe::subobj_t,_std::allocator<qe::subobj_t>_>::push_back
            (&this->_objects,(value_type *)local_2a0);
  bVar3 = std::ios::bad();
  if ((bVar3 & 1) == 0) {
    sVar13 = std::
             vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
             ::size((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                     *)&tobj.size);
    if (sVar13 == 0) {
      index.field_0.field_0.y._3_1_ = 1;
      plVar15 = (loader_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&i,(string *)&this->_path);
      std::operator+(&local_610,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     " (no indices found)");
      loader_error::loader_error
                (plVar15,&local_610,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                 ,0x137);
      index.field_0.field_0.y._3_1_ = 0;
      __cxa_throw(plVar15,&loader_error::typeinfo,loader_error::~loader_error);
    }
    sVar13 = std::
             vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
             ::size((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                     *)&tobj.size);
    if (sVar13 % 3 != 0) {
      __assert_fail("indices.size() % 3 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                    ,0x139,"void qe::Loader<7>::load()");
    }
    index.field_0.field_0.x = 0;
    while( true ) {
      uVar14 = (ulong)(uint)index.field_0.field_0.x;
      sVar13 = std::
               vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
               ::size((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       *)&tobj.size);
      if (sVar13 <= uVar14) {
        subobj_t::~subobj_t((subobj_t *)local_2a0);
        std::
        vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
        ::~vector((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                   *)&tobj.size);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&indices.
                      super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&tnormals.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::ifstream::~ifstream(&local_218);
        return;
      }
      pvVar16 = std::
                vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                ::operator[]((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                              *)&tobj.size,(ulong)(uint)index.field_0.field_0.x);
      uVar1 = (pvVar16->field_0).field_0.x;
      sVar13 = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       *)&tnormals.
                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar13 < uVar1) break;
      pvVar16 = std::
                vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                ::operator[]((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                              *)&tobj.size,(ulong)(uint)index.field_0.field_0.x);
      uVar1 = (pvVar16->field_0).field_0.y;
      sVar13 = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       *)&indices.
                          super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar13 < uVar1) {
        __assert_fail("indices[i].y <= tnormals.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                      ,0x13d,"void qe::Loader<7>::load()");
      }
      pvVar16 = std::
                vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                ::operator[]((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                              *)&tobj.size,(ulong)(uint)index.field_0.field_0.x);
      glm::vec<2,int,(glm::qualifier)0>::vec<unsigned_int,(glm::qualifier)0>
                ((vec<2,int,(glm::qualifier)0> *)&local_640,pvVar16);
      __args = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             *)&tnormals.
                                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)(local_640 + -1));
      __args_1 = std::
                 vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               *)&indices.
                                  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)(local_63c + -1));
      std::vector<qe::objv3_point_t,std::allocator<qe::objv3_point_t>>::
      emplace_back<glm::vec<3,float,(glm::qualifier)0>&,glm::vec<3,float,(glm::qualifier)0>&>
                ((vector<qe::objv3_point_t,std::allocator<qe::objv3_point_t>> *)this,__args,__args_1
                );
      index.field_0.field_0.x = index.field_0.field_0.x + 1;
    }
    __assert_fail("indices[i].x <= tvertices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                  ,0x13c,"void qe::Loader<7>::load()");
  }
  local_5e9 = 1;
  plVar15 = (loader_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_5e8,(string *)&this->_path);
  loader_error::loader_error
            (plVar15,&local_5e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
             ,0x135);
  local_5e9 = 0;
  __cxa_throw(plVar15,&loader_error::typeinfo,loader_error::~loader_error);
}

Assistant:

void load() {
            std::ifstream file(_path);
            file.exceptions(std::ifstream::badbit);
            std::vector<glm::vec3> tvertices;
            std::vector<glm::vec3> tnormals;
            std::vector<glm::uvec2> indices;

            subobj_t tobj {"", 0, 0};

            for(std::string line; std::getline(file, line, '\n');) {
                if(startswith(line, "v ")) {
                    glm::vec3 v;

                    switch(sscanf(line.c_str(), "v %f %f %f", &v.x, &v.y, &v.z)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + "(" + line + ")", __FILE__, __LINE__);
                    }

                    tvertices.push_back(v);
                } else if(startswith(line, "vn ")) {
                    glm::vec3 v;

                    switch(sscanf(line.c_str(), "vn %f %f %f", &v.x, &v.y, &v.z)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + "(" + line + ")", __FILE__, __LINE__);
                    }

                    tnormals.push_back(v);
                } else if(startswith(line, "f ")) {
                    std::array<glm::uvec2, 3> points;

                    switch(sscanf(line.c_str(), "f %u//%u %u//%u %u//%u",
                                  &points[0].x, &points[0].y,
                                  &points[1].x, &points[1].y,
                                  &points[2].x, &points[2].y)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + " (" + line + ")", __FILE__, __LINE__);
                    }

                    indices.push_back(points[0]);
                    indices.push_back(points[1]);
                    indices.push_back(points[2]);
                } else if(startswith(line, "o ")) {
                    tobj.size = indices.size() - tobj.index;
                    if(tobj.name.empty()) tobj.name = "FIRSTNONAME";
                    _objects.push_back(tobj);
                    tobj.name = line.substr(2);
                    tobj.index = indices.size();
                }
            }

            tobj.size = indices.size() - tobj.index;
            if(tobj.name.empty()) tobj.name = "NONAME";
            _objects.push_back(tobj);

            if(file.bad()) throw loader_error(_path, __FILE__, __LINE__);

            if(indices.size() == 0) throw loader_error(std::string(_path) + " (no indices found)", __FILE__, __LINE__);

            assert(indices.size() % 3 == 0);

            for(unsigned int i = 0; i < indices.size(); ++i) {
                assert(indices[i].x <= tvertices.size());
                assert(indices[i].y <= tnormals.size());
                glm::ivec2 index = indices[i];
                _points.emplace_back(tvertices[index.x - 1], tnormals[index.y - 1]);
            }
        }